

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int send_detach(LINK_INSTANCE *link_instance,_Bool close,ERROR_HANDLE error_handle)

{
  int iVar1;
  DETACH_HANDLE detach;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  DETACH_HANDLE detach_performative;
  int result;
  ERROR_HANDLE error_handle_local;
  _Bool close_local;
  LINK_INSTANCE *link_instance_local;
  
  detach = detach_create(0);
  if (detach == (DETACH_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"send_detach",0xd8,1,"NULL detach performative");
    }
    detach_performative._4_4_ = 0xd9;
  }
  else {
    if ((error_handle == (ERROR_HANDLE)0x0) ||
       (iVar1 = detach_set_error(detach,error_handle), iVar1 == 0)) {
      if ((close) && (iVar1 = detach_set_closed(detach,true), iVar1 != 0)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"send_detach",0xe6,1,"Failed setting closed field on detach frame");
        }
        detach_performative._4_4_ = 0xe7;
      }
      else {
        iVar1 = session_send_detach(link_instance->link_endpoint,detach);
        if (iVar1 == 0) {
          if (close) {
            link_instance->is_closed = true;
          }
          detach_performative._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                      ,"send_detach",0xed,1,"Sending detach frame failed in session send");
          }
          detach_performative._4_4_ = 0xee;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"send_detach",0xe0,1,"Failed setting error on detach frame");
      }
      detach_performative._4_4_ = 0xe1;
    }
    detach_destroy(detach);
  }
  return detach_performative._4_4_;
}

Assistant:

static int send_detach(LINK_INSTANCE* link_instance, bool close, ERROR_HANDLE error_handle)
{
    int result;
    DETACH_HANDLE detach_performative;

    detach_performative = detach_create(0);
    if (detach_performative == NULL)
    {
        LogError("NULL detach performative");
        result = MU_FAILURE;
    }
    else
    {
        if ((error_handle != NULL) &&
            (detach_set_error(detach_performative, error_handle) != 0))
        {
            LogError("Failed setting error on detach frame");
            result = MU_FAILURE;
        }
        else if (close &&
            (detach_set_closed(detach_performative, true) != 0))
        {
            LogError("Failed setting closed field on detach frame");
            result = MU_FAILURE;
        }
        else
        {
            if (session_send_detach(link_instance->link_endpoint, detach_performative) != 0)
            {
                LogError("Sending detach frame failed in session send");
                result = MU_FAILURE;
            }
            else
            {
                if (close)
                {
                    /* Declare link to be closed */
                    link_instance->is_closed = true;
                }

                result = 0;
            }
        }

        detach_destroy(detach_performative);
    }

    return result;
}